

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTNode.cpp
# Opt level: O3

void __thiscall AST::ASTNode::ASTNode(ASTNode *this,string *name,Token *token)

{
  int iVar1;
  string local_50;
  
  this->_vptr_ASTNode = (_func_int **)&PTR_accept_0014c310;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::_M_initialize_map
            (&(this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>,0)
  ;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  if (token != (Token *)0x0) {
    iVar1 = Token::getLineno(token);
    this->lineNumber = iVar1;
    Token::getTypeString_abi_cxx11_(&local_50,token);
    std::__cxx11::string::operator=((string *)&this->type,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = counter + 1;
  this->uniqueID = counter;
  counter = iVar1;
  return;
}

Assistant:

AST::ASTNode::ASTNode(std::string name, Token *token) {
    this->name = std::move(name);
    if (token != nullptr) {
        this->lineNumber = token->getLineno();
        this->type = token->getTypeString();
    }
    uniqueID = counter++;
}